

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void RGB565ToYRow_C(uint8_t *src_rgb565,uint8_t *dst_y,int width)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)width;
  if (width < 1) {
    uVar4 = uVar5;
  }
  for (; (int)uVar4 != (int)uVar5; uVar5 = uVar5 + 1) {
    bVar1 = src_rgb565[uVar5 * 2];
    bVar2 = src_rgb565[uVar5 * 2 + 1];
    iVar3 = libyuv::RGBToY(bVar2 & 0xf8 | bVar2 >> 5,bVar2 >> 1 & 3 | bVar1 >> 3 & 0x1c | bVar2 << 5
                           ,bVar1 >> 2 & 7 | bVar1 * '\b');
    dst_y[uVar5] = (uint8_t)iVar3;
  }
  return;
}

Assistant:

void RGB565ToYRow_C(const uint8_t* src_rgb565, uint8_t* dst_y, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_rgb565[0] & 0x1f;
    uint8_t g = (src_rgb565[0] >> 5) | ((src_rgb565[1] & 0x07) << 3);
    uint8_t r = src_rgb565[1] >> 3;
    b = (b << 3) | (b >> 2);
    g = (g << 2) | (g >> 4);
    r = (r << 3) | (r >> 2);
    dst_y[0] = RGBToY(r, g, b);
    src_rgb565 += 2;
    dst_y += 1;
  }
}